

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QUnicodeTools::ScriptItem>::emplace_back_impl<QUnicodeTools::ScriptItem>
          (QVLABase<QUnicodeTools::ScriptItem> *this,qsizetype prealloc,void *array,ScriptItem *args
          )

{
  qsizetype *pqVar1;
  void *pvVar2;
  qsizetype qVar3;
  long lVar4;
  
  lVar4 = (this->super_QVLABaseBase).s;
  if (lVar4 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar4 = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (this->super_QVLABaseBase).ptr;
  qVar3 = *(qsizetype *)&args->script;
  pqVar1 = (qsizetype *)((long)pvVar2 + lVar4 * 0x10);
  *pqVar1 = args->position;
  pqVar1[1] = qVar3;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar2 + lVar4 * 0x10);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }